

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamToolsIndex::CheckVersion(BamToolsIndex *this)

{
  int32_t *x;
  uint uVar1;
  IBamIODevice *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  BamException *pBVar4;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string message;
  
  pIVar2 = (this->m_resources).Device;
  x = &this->m_inputVersion;
  iVar3 = (*pIVar2->_vptr_IBamIODevice[5])(pIVar2,x,4);
  if (CONCAT44(extraout_var,iVar3) != 4) {
    pBVar4 = (BamException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&message,"BamToolsIndex::CheckVersion",&local_5a);
    std::__cxx11::string::string((string *)&local_58,"could not read format version",&local_59);
    BamException::BamException(pBVar4,&message,&local_58);
    __cxa_throw(pBVar4,&BamException::typeinfo,BamException::~BamException);
  }
  if (this->m_isBigEndian == true) {
    SwapEndian_32(x);
  }
  uVar1 = *x;
  if ((int)uVar1 < 1) {
    pBVar4 = (BamException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&message,"BamToolsIndex::CheckVersion",&local_5a);
    std::__cxx11::string::string((string *)&local_58,"invalid format version",&local_59);
    BamException::BamException(pBVar4,&message,&local_58);
    __cxa_throw(pBVar4,&BamException::typeinfo,BamException::~BamException);
  }
  if ((int)this->m_outputVersion < (int)uVar1) {
    std::__cxx11::string::string
              ((string *)&message,
               "unsupported format: this index was created by a newer version of BamTools. Update your local version of BamTools to use the index file."
               ,(allocator *)&local_58);
    pBVar4 = (BamException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_58,"BamToolsIndex::CheckVersion",&local_5a);
    BamException::BamException(pBVar4,&local_58,&message);
    __cxa_throw(pBVar4,&BamException::typeinfo,BamException::~BamException);
  }
  if (3 < uVar1) {
    return;
  }
  std::__cxx11::string::string
            ((string *)&message,
             "unsupported format: this version of the index may not properly handle coordinate intervals. Please run \'bamtools index -bti -in yourData.bam\' to generate an up-to-date, fixed BTI file."
             ,(allocator *)&local_58);
  pBVar4 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_58,"BamToolsIndex::CheckVersion",&local_5a);
  BamException::BamException(pBVar4,&local_58,&message);
  __cxa_throw(pBVar4,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::CheckVersion(void) {

    // read version from file
    const int64_t numBytesRead = m_resources.Device->Read((char*)&m_inputVersion, sizeof(m_inputVersion));
    if ( numBytesRead != sizeof(m_inputVersion) )
        throw BamException("BamToolsIndex::CheckVersion", "could not read format version");
    if ( m_isBigEndian ) SwapEndian_32(m_inputVersion);

    // if version is negative, or zero
    if ( m_inputVersion <= 0 )
        throw BamException("BamToolsIndex::CheckVersion", "invalid format version");

    // if version is newer than can be supported by this version of bamtools
    else if ( m_inputVersion > m_outputVersion ) {
        const string message = "unsupported format: this index was created by a newer version of BamTools. "
                               "Update your local version of BamTools to use the index file.";
        throw BamException("BamToolsIndex::CheckVersion", message);
    }

    // ------------------------------------------------------------------
    // check for deprecated, unsupported versions
    // (the format had to be modified to accomodate a particular bug fix)

    // Version 2.0: introduced support for half-open intervals, instead of the old closed intervals
    //   respondBy: throwing exception - we're not going to try to handle the old BTI files.
    else if ( (Version)m_inputVersion < BamToolsIndex::BTI_2_0 ) {
        const string message = "unsupported format: this version of the index may not properly handle "
                               "coordinate intervals. Please run 'bamtools index -bti -in yourData.bam' "
                               "to generate an up-to-date, fixed BTI file.";
        throw BamException("BamToolsIndex::CheckVersion", message);
    }
}